

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::vector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *other,
        polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *alloc)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,other->nStored);
  uVar5 = other->nStored;
  if (uVar5 != 0) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      pbVar2 = this->ptr;
      pcVar1 = (pbVar2->field_2)._M_local_buf + lVar6;
      pbVar3 = other->ptr;
      *(char **)(pcVar1 + -0x10) = pcVar1;
      lVar4 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6);
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar6),lVar4,
                 *(long *)((long)&pbVar3->_M_string_length + lVar6) + lVar4);
      uVar7 = uVar7 + 1;
      uVar5 = other->nStored;
      lVar6 = lVar6 + 0x20;
    } while (uVar7 < uVar5);
  }
  this->nStored = uVar5;
  return;
}

Assistant:

vector(const vector &other, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            this->alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();
    }